

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderStorageTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::genCommonSource_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          GLenum shaderType)

{
  bool bVar1;
  ContextType ctxType;
  char *pcVar2;
  size_t sVar3;
  string *psVar4;
  long lVar5;
  int iVar6;
  ostringstream source;
  undefined1 local_198 [376];
  
  ctxType.super_ApiType.m_bits = (ApiType)(**(code **)(*(long *)this + 0x10))(this);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar2 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(_func_int **)(local_198._0_8_ + -0x18));
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
  pcVar2 = glcts::fixed_sample_locations_values + 1;
  iVar6 = (int)ctx;
  if (!bVar1) {
    if (iVar6 - 0x8e87U < 2) {
      pcVar2 = "#extension GL_EXT_tessellation_shader : require\n";
    }
    else if (iVar6 == 0x8dd9) {
      pcVar2 = "#extension GL_EXT_geometry_shader : require\n";
    }
  }
  sVar3 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,sVar3);
  if (iVar6 == 0x8e87) {
    lVar5 = 0x29;
    pcVar2 = "layout(triangles, equal_spacing, cw) in;\n";
  }
  else {
    if (iVar6 != 0x8e88) goto LAB_0166a3bb;
    lVar5 = 0x1a;
    pcVar2 = "layout(vertices = 3) out;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar2,lVar5);
LAB_0166a3bb:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"void main() {}\n",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  psVar4 = (string *)std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return psVar4;
}

Assistant:

std::string genCommonSource (NegativeTestContext& ctx, glw::GLenum shaderType)
{
	const bool				isES32		= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version		= isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	std::ostringstream		source;

	source << glu::getGLSLVersionDeclaration(version) << "\n"
		   << ((isES32) ? "" : getShaderExtensionDeclaration(shaderType));

	switch (shaderType)
	{
		case GL_TESS_CONTROL_SHADER:
			source	<< "layout(vertices = 3) out;\n"
					<< "void main() {}\n";
			break;

		case GL_TESS_EVALUATION_SHADER:
			source	<< "layout(triangles, equal_spacing, cw) in;\n"
					<< "void main() {}\n";
			break;

		default:
			source  << "void main() {}\n";
			break;
	}

	return source.str();
}